

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cc
# Opt level: O0

void __thiscall
cnn::LSTMBuilder::LSTMBuilder
          (LSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,Model *model)

{
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<cnn::Parameters_*> __l;
  Parameters *pPVar1;
  Parameters *this_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  Dim *in_R8;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> ps;
  Parameters *p_bc;
  Parameters *p_h2c;
  Parameters *p_x2c;
  Parameters *p_bo;
  Parameters *p_c2o;
  Parameters *p_h2o;
  Parameters *p_x2o;
  Parameters *p_bi;
  Parameters *p_c2i;
  Parameters *p_h2i;
  Parameters *p_x2i;
  uint i;
  uint layer_input_dim;
  RNNBuilder *in_stack_fffffffffffffb40;
  Dim *__x;
  Parameters *in_stack_fffffffffffffb60;
  Dim *in_stack_fffffffffffffb68;
  Parameters *in_stack_fffffffffffffb70;
  Dim *pDVar2;
  Parameters *local_3d0;
  Parameters *local_3c8;
  Parameters *local_3c0;
  Parameters *local_3b8;
  Parameters *local_3b0;
  Parameters *local_3a8;
  Parameters *local_3a0;
  Parameters *local_398;
  Parameters *local_390;
  Parameters *local_388;
  Parameters *local_380;
  Parameters **local_378;
  undefined8 local_370;
  undefined4 local_34c;
  undefined4 *local_348;
  undefined8 local_340;
  Parameters *local_310;
  undefined4 local_308;
  undefined4 local_304;
  undefined4 *local_300;
  undefined8 local_2f8;
  Parameters *local_2c8;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 *local_2b8;
  undefined8 local_2b0;
  Parameters *local_280;
  undefined4 local_274;
  undefined4 *local_270;
  undefined8 local_268;
  Parameters *local_238;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 *local_228;
  undefined8 local_220;
  Parameters *local_1f0;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 *local_1e0;
  undefined8 local_1d8;
  Parameters *local_1a8;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 *local_198;
  undefined8 local_190;
  Parameters *local_160;
  undefined4 local_154;
  undefined4 *local_150;
  undefined8 local_148;
  Parameters *local_118;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 *local_108;
  undefined8 local_100;
  Parameters *local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 *local_c0;
  undefined8 local_b8;
  Parameters *local_88;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 *local_68;
  undefined8 local_60;
  Parameters *local_30;
  uint local_28;
  undefined4 local_24;
  Dim *local_20;
  undefined4 local_14;
  undefined4 local_10;
  uint local_c;
  
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  RNNBuilder::RNNBuilder(in_stack_fffffffffffffb40);
  *in_RDI = &PTR__LSTMBuilder_007e3308;
  std::
  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ::vector((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
            *)0x51a408);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)0x51a421);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)0x51a43a);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)0x51a453);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)0x51a46f);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)0x51a48b);
  *(uint *)(in_RDI + 0x18) = local_c;
  local_24 = local_10;
  for (local_28 = 0; local_28 < local_c; local_28 = local_28 + 1) {
    local_70 = local_14;
    local_6c = local_24;
    local_68 = &local_70;
    local_60 = 2;
    x._M_len = (size_type)in_stack_fffffffffffffb70;
    x._M_array = in_stack_fffffffffffffb68->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffb60,x);
    local_30 = Model::add_parameters
                         ((Model *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                          (float)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    local_c8 = local_14;
    local_c4 = local_14;
    local_c0 = &local_c8;
    local_b8 = 2;
    x_00._M_len = (size_type)in_stack_fffffffffffffb70;
    x_00._M_array = in_stack_fffffffffffffb68->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffb60,x_00);
    local_88 = Model::add_parameters
                         ((Model *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                          (float)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    local_110 = local_14;
    local_10c = local_14;
    local_108 = &local_110;
    local_100 = 2;
    x_01._M_len = (size_type)in_stack_fffffffffffffb70;
    x_01._M_array = in_stack_fffffffffffffb68->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffb60,x_01);
    local_d0 = Model::add_parameters
                         ((Model *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                          (float)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    local_154 = local_14;
    local_150 = &local_154;
    local_148 = 1;
    x_02._M_len = (size_type)in_stack_fffffffffffffb70;
    x_02._M_array = in_stack_fffffffffffffb68->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffb60,x_02);
    local_118 = Model::add_parameters
                          ((Model *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                           (float)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    local_1a0 = local_14;
    local_19c = local_24;
    local_198 = &local_1a0;
    local_190 = 2;
    x_03._M_len = (size_type)in_stack_fffffffffffffb70;
    x_03._M_array = in_stack_fffffffffffffb68->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffb60,x_03);
    local_160 = Model::add_parameters
                          ((Model *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                           (float)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    local_1e8 = local_14;
    local_1e4 = local_14;
    local_1e0 = &local_1e8;
    local_1d8 = 2;
    x_04._M_len = (size_type)in_stack_fffffffffffffb70;
    x_04._M_array = in_stack_fffffffffffffb68->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffb60,x_04);
    local_1a8 = Model::add_parameters
                          ((Model *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                           (float)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    local_230 = local_14;
    local_22c = local_14;
    local_228 = &local_230;
    local_220 = 2;
    x_05._M_len = (size_type)in_stack_fffffffffffffb70;
    x_05._M_array = in_stack_fffffffffffffb68->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffb60,x_05);
    pPVar1 = Model::add_parameters
                       ((Model *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                        (float)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    local_274 = local_14;
    local_270 = &local_274;
    local_268 = 1;
    x_06._M_len = (size_type)in_stack_fffffffffffffb70;
    x_06._M_array = in_stack_fffffffffffffb68->d;
    pDVar2 = local_20;
    local_1f0 = pPVar1;
    Dim::Dim((Dim *)in_stack_fffffffffffffb60,x_06);
    in_stack_fffffffffffffb70 =
         Model::add_parameters
                   ((Model *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                    (float)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    local_2c0 = local_14;
    local_2bc = local_24;
    local_2b8 = &local_2c0;
    local_2b0 = 2;
    x_07._M_len = (size_type)in_stack_fffffffffffffb70;
    x_07._M_array = local_20->d;
    in_stack_fffffffffffffb68 = local_20;
    local_238 = in_stack_fffffffffffffb70;
    Dim::Dim((Dim *)in_stack_fffffffffffffb60,x_07);
    in_stack_fffffffffffffb60 =
         Model::add_parameters
                   ((Model *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                    (float)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    local_308 = local_14;
    local_304 = local_14;
    local_300 = &local_308;
    local_2f8 = 2;
    x_08._M_len = (size_type)in_stack_fffffffffffffb70;
    x_08._M_array = in_stack_fffffffffffffb68->d;
    local_280 = in_stack_fffffffffffffb60;
    Dim::Dim((Dim *)in_stack_fffffffffffffb60,x_08);
    this_00 = Model::add_parameters
                        ((Model *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                         (float)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    local_34c = local_14;
    local_348 = &local_34c;
    local_340 = 1;
    x_09._M_len = (size_type)in_stack_fffffffffffffb70;
    x_09._M_array = in_stack_fffffffffffffb68->d;
    __x = local_20;
    local_2c8 = this_00;
    Dim::Dim((Dim *)in_stack_fffffffffffffb60,x_09);
    local_380 = Model::add_parameters
                          ((Model *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                           (float)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    local_24 = local_14;
    local_3d0 = local_30;
    local_3c8 = local_88;
    local_3c0 = local_d0;
    local_3b8 = local_118;
    local_3b0 = local_160;
    local_3a8 = local_1a8;
    local_3a0 = local_1f0;
    local_398 = local_238;
    local_390 = local_280;
    local_388 = local_2c8;
    local_378 = &local_3d0;
    local_370 = 0xb;
    local_310 = local_380;
    std::allocator<cnn::Parameters_*>::allocator((allocator<cnn::Parameters_*> *)0x51abd2);
    __l._M_len = (size_type)pPVar1;
    __l._M_array = (iterator)pDVar2;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::vector
              ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
               in_stack_fffffffffffffb70,__l,(allocator_type *)in_stack_fffffffffffffb68);
    std::allocator<cnn::Parameters_*>::~allocator((allocator<cnn::Parameters_*> *)0x51ac02);
    std::
    vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
    ::push_back((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                 *)this_00,(value_type *)__x);
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::~vector
              ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)this_00);
  }
  *(undefined4 *)((long)in_RDI + 0xc4) = 0;
  return;
}

Assistant:

LSTMBuilder::LSTMBuilder(unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         Model* model) : layers(layers) {
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameters* p_x2i = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2i = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_c2i = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bi = model->add_parameters({hidden_dim});

    // o
    Parameters* p_x2o = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2o = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_c2o = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bo = model->add_parameters({hidden_dim});

    // c
    Parameters* p_x2c = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2c = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bc = model->add_parameters({hidden_dim});
    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameters*> ps = {p_x2i, p_h2i, p_c2i, p_bi, p_x2o, p_h2o, p_c2o, p_bo, p_x2c, p_h2c, p_bc};
    params.push_back(ps);
  }  // layers
  dropout_rate = 0.0f;
}